

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# craigtracer.cpp
# Opt level: O3

void __thiscall CaDiCraig::CraigTracer::reset_assumptions(CraigTracer *this)

{
  pointer puVar1;
  pointer piVar2;
  unsigned_long *id;
  pointer puVar3;
  
  puVar1 = (this->assumption_clauses).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (this->assumption_clauses).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    (*(this->super_Tracer)._vptr_Tracer[4])
              (this,*puVar3,1,
               (this->craig_clauses).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (*puVar3 - 1));
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(this->assumptions)._M_t);
  piVar2 = (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar2;
  }
  puVar3 = (this->assumption_clauses).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->assumption_clauses).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar3) {
    (this->assumption_clauses).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar3;
  }
  return;
}

Assistant:

void CraigTracer::reset_assumptions () {
  for (auto &id : assumption_clauses) {
    delete_clause (id, true, craig_clauses[id - 1]);
  }
  assumptions.clear ();
  constraint.clear ();
  assumption_clauses.clear ();
}